

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlParserErrors
xmlFindExtraHandler(char *norig,char *name,xmlCharEncFlags flags,xmlCharEncConvImpl impl,
                   void *implCtxt,xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandlerPtr pxVar1;
  bool bVar2;
  xmlParserErrors xVar3;
  int iVar4;
  char *pcVar5;
  undefined8 *inputCtxt;
  undefined8 *outputCtxt;
  iconv_t pvVar6;
  int *piVar7;
  code *output;
  xmlIconvCtxt *ctxt;
  xmlIconvCtxt *ctxt_1;
  long lVar8;
  code *input;
  
  if (impl != (xmlCharEncConvImpl)0x0) {
    xVar3 = (*impl)(implCtxt,norig,flags,out);
    return xVar3;
  }
  if ((globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) &&
     (bVar2 = 0 < nbCharEncodingHandler, 0 < nbCharEncodingHandler)) {
    lVar8 = 0;
    do {
      pxVar1 = globalHandlers[lVar8];
      iVar4 = xmlStrcasecmp((xmlChar *)name,(xmlChar *)pxVar1->name);
      if (((iVar4 == 0) &&
          (((flags & XML_ENC_INPUT) == 0 || ((pxVar1->input).func != (xmlCharEncConvFunc)0x0)))) &&
         (((flags & XML_ENC_OUTPUT) == 0 || ((pxVar1->output).func != (xmlCharEncConvFunc)0x0)))) {
        *out = pxVar1;
        if (bVar2) {
          return XML_ERR_OK;
        }
        break;
      }
      lVar8 = lVar8 + 1;
      bVar2 = lVar8 < nbCharEncodingHandler;
    } while (lVar8 < nbCharEncodingHandler);
  }
  pcVar5 = strstr(name,"//");
  xVar3 = XML_ERR_UNSUPPORTED_ENCODING;
  if (pcVar5 != (char *)0x0) {
    inputCtxt = (undefined8 *)0x0;
    goto LAB_00129828;
  }
  if ((flags & XML_ENC_INPUT) == 0) {
    inputCtxt = (undefined8 *)0x0;
    input = (xmlCharEncConvFunc)0x0;
LAB_001298cc:
    if ((flags & XML_ENC_OUTPUT) == 0) {
      output = (xmlCharEncConvFunc)0x0;
      outputCtxt = (undefined8 *)0x0;
LAB_00129916:
      xVar3 = xmlCharEncNewCustomHandler(name,input,output,xmlIconvFree,inputCtxt,outputCtxt,out);
      return xVar3;
    }
    outputCtxt = (undefined8 *)(*xmlMalloc)(8);
    if (outputCtxt == (undefined8 *)0x0) goto LAB_00129939;
    *outputCtxt = 0xffffffffffffffff;
    pvVar6 = iconv_open(name,"UTF-8");
    if (pvVar6 != (iconv_t)0xffffffffffffffff) {
      *outputCtxt = pvVar6;
      output = xmlIconvConvert;
      goto LAB_00129916;
    }
    piVar7 = __errno_location();
    if (*piVar7 == 0x16) goto LAB_0012982b;
    if (*piVar7 != 0xc) {
      xVar3 = XML_ERR_SYSTEM;
      goto LAB_0012982b;
    }
  }
  else {
    inputCtxt = (undefined8 *)(*xmlMalloc)(8);
    if (inputCtxt != (undefined8 *)0x0) {
      *inputCtxt = 0xffffffffffffffff;
      pvVar6 = iconv_open("UTF-8",name);
      if (pvVar6 == (iconv_t)0xffffffffffffffff) {
        piVar7 = __errno_location();
        if (*piVar7 != 0x16) {
          if (*piVar7 == 0xc) goto LAB_00129939;
          xVar3 = XML_ERR_SYSTEM;
        }
LAB_00129828:
        outputCtxt = (undefined8 *)0x0;
        goto LAB_0012982b;
      }
      *inputCtxt = pvVar6;
      input = xmlIconvConvert;
      goto LAB_001298cc;
    }
    inputCtxt = (undefined8 *)0x0;
LAB_00129939:
    outputCtxt = (undefined8 *)0x0;
  }
  xVar3 = XML_ERR_NO_MEMORY;
LAB_0012982b:
  if (inputCtxt != (undefined8 *)0x0) {
    if ((iconv_t)*inputCtxt != (iconv_t)0xffffffffffffffff) {
      iconv_close((iconv_t)*inputCtxt);
    }
    (*xmlFree)(inputCtxt);
  }
  if (outputCtxt != (undefined8 *)0x0) {
    if ((iconv_t)*outputCtxt != (iconv_t)0xffffffffffffffff) {
      iconv_close((iconv_t)*outputCtxt);
    }
    (*xmlFree)(outputCtxt);
  }
  return xVar3;
}

Assistant:

static xmlParserErrors
xmlFindExtraHandler(const char *norig, const char *name, xmlCharEncFlags flags,
                    xmlCharEncConvImpl impl, void *implCtxt,
                    xmlCharEncodingHandler **out) {
    /*
     * Try custom implementation before deprecated global handlers.
     *
     * Note that we pass the original name without deprecated
     * alias resolution.
     */
    if (impl != NULL)
        return(impl(implCtxt, norig, flags, out));

    /*
     * Deprecated
     */
    if (globalHandlers != NULL) {
        int i;

        for (i = 0; i < nbCharEncodingHandler; i++) {
            xmlCharEncodingHandler *h = globalHandlers[i];

            if (!xmlStrcasecmp((const xmlChar *) name,
                               (const xmlChar *) h->name)) {
                if ((((flags & XML_ENC_INPUT) == 0) || (h->input.func)) &&
                    (((flags & XML_ENC_OUTPUT) == 0) || (h->output.func))) {
                    *out = h;
                    return(XML_ERR_OK);
                }
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    {
        int ret = xmlCharEncIconv(name, flags, out);

        if (ret == XML_ERR_OK)
            return(XML_ERR_OK);
        if (ret != XML_ERR_UNSUPPORTED_ENCODING)
            return(ret);
    }
#endif /* LIBXML_ICONV_ENABLED */

#ifdef LIBXML_ICU_ENABLED
    {
        int ret = xmlCharEncUconv(name, flags, out);

        if (ret == XML_ERR_OK)
            return(XML_ERR_OK);
        if (ret != XML_ERR_UNSUPPORTED_ENCODING)
            return(ret);
    }
#endif /* LIBXML_ICU_ENABLED */

    return(XML_ERR_UNSUPPORTED_ENCODING);
}